

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O3

void __thiscall
OpenMD::Integrator::setVelocitizer
          (Integrator *this,
          unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_> *velocitizer)

{
  Velocitizer *pVVar1;
  Velocitizer *pVVar2;
  
  pVVar1 = (velocitizer->_M_t).
           super___uniq_ptr_impl<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>.
           _M_t.
           super__Tuple_impl<0UL,_OpenMD::Velocitizer_*,_std::default_delete<OpenMD::Velocitizer>_>.
           super__Head_base<0UL,_OpenMD::Velocitizer_*,_false>._M_head_impl;
  (velocitizer->_M_t).
  super___uniq_ptr_impl<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>._M_t.
  super__Tuple_impl<0UL,_OpenMD::Velocitizer_*,_std::default_delete<OpenMD::Velocitizer>_>.
  super__Head_base<0UL,_OpenMD::Velocitizer_*,_false>._M_head_impl = (Velocitizer *)0x0;
  pVVar2 = (this->velocitizer_)._M_t.
           super___uniq_ptr_impl<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>.
           _M_t.
           super__Tuple_impl<0UL,_OpenMD::Velocitizer_*,_std::default_delete<OpenMD::Velocitizer>_>.
           super__Head_base<0UL,_OpenMD::Velocitizer_*,_false>._M_head_impl;
  (this->velocitizer_)._M_t.
  super___uniq_ptr_impl<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>._M_t.
  super__Tuple_impl<0UL,_OpenMD::Velocitizer_*,_std::default_delete<OpenMD::Velocitizer>_>.
  super__Head_base<0UL,_OpenMD::Velocitizer_*,_false>._M_head_impl = pVVar1;
  if (pVVar2 != (Velocitizer *)0x0) {
    (*pVVar2->_vptr_Velocitizer[1])();
    return;
  }
  return;
}

Assistant:

void Integrator::setVelocitizer(std::unique_ptr<Velocitizer> velocitizer) {
    velocitizer_ = std::move(velocitizer);
  }